

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

bool __thiscall clickhouse::Client::Impl::SendHello(Impl *this)

{
  uint64_t in_RDI;
  CodedOutputStream *output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  CodedOutputStream *in_stack_ffffffffffffffa0;
  allocator<char> local_49;
  string local_48 [8];
  allocator<char> *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  string local_28 [40];
  
  output = (CodedOutputStream *)(in_RDI + 0x1b0);
  WireFormat::WriteUInt64(output,in_RDI);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::operator+(__lhs,(char *)output);
  WireFormat::WriteString(in_stack_ffffffffffffffa0,__lhs);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  WireFormat::WriteUInt64(output,in_RDI);
  WireFormat::WriteUInt64(output,in_RDI);
  WireFormat::WriteUInt64(output,in_RDI);
  WireFormat::WriteString(in_stack_ffffffffffffffa0,__lhs);
  WireFormat::WriteString(in_stack_ffffffffffffffa0,__lhs);
  WireFormat::WriteString(in_stack_ffffffffffffffa0,__lhs);
  CodedOutputStream::Flush((CodedOutputStream *)0x24db29);
  return true;
}

Assistant:

bool Client::Impl::SendHello() {
    WireFormat::WriteUInt64(&output_, ClientCodes::Hello);
    WireFormat::WriteString(&output_, std::string(DBMS_NAME) + " client");
    WireFormat::WriteUInt64(&output_, DBMS_VERSION_MAJOR);
    WireFormat::WriteUInt64(&output_, DBMS_VERSION_MINOR);
    WireFormat::WriteUInt64(&output_, REVISION);
    WireFormat::WriteString(&output_, options_.default_database);
    WireFormat::WriteString(&output_, options_.user);
    WireFormat::WriteString(&output_, options_.password);

    output_.Flush();

    return true;
}